

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

OrphanBuilder *
capnp::_::OrphanBuilder::concat
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ElementSize elementSize,StructSize structSize,ArrayPtr<const_capnp::_::ListReader> lists)

{
  byte *from;
  PointerReader other;
  StructReader other_00;
  bool bVar1;
  WiderType<Decay<unsigned_short_&>,_Decay<const_unsigned_short_&>_> WVar2;
  ListElementCount LVar3;
  WiderType<Decay<unsigned_short_&>,_Decay<unsigned_long>_> WVar4;
  WirePointer *pWVar5;
  uint *puVar6;
  ListReader *pLVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  word *pwVar10;
  bool local_2e1;
  unsigned_long count;
  ListReader *list_4;
  ListReader *__end3_3;
  ListReader *__begin3_3;
  ArrayPtr<const_capnp::_::ListReader> *__range3_3;
  CapTableBuilder *pCStack_298;
  uint step;
  byte *target;
  Iterator local_288;
  uint i_2;
  Iterator __end4_2;
  Iterator __begin4_2;
  Range<unsigned_int> *__range4_2;
  ListReader *list_3;
  ListReader *__end3_2;
  ListReader *__begin3_2;
  ArrayPtr<const_capnp::_::ListReader> *__range3_2;
  undefined1 auStack_248 [4];
  ListElementCount pos_2;
  CapTableReader *pCStack_240;
  WirePointer *local_238;
  int iStack_230;
  undefined4 uStack_22c;
  PointerBuilder local_228;
  ElementCount local_20c;
  Iterator local_208;
  uint i_1;
  Iterator __end4_1;
  Iterator __begin4_1;
  Range<unsigned_int> *__range4_1;
  ListReader *list_2;
  ListReader *__end3_1;
  ListReader *__begin3_1;
  ArrayPtr<const_capnp::_::ListReader> *__range3_1;
  undefined1 auStack_1c8 [4];
  ListElementCount pos_1;
  CapTableReader *pCStack_1c0;
  void *local_1b8;
  WirePointer *pWStack_1b0;
  StructDataBitCount local_1a8;
  StructPointerCount SStack_1a4;
  undefined2 uStack_1a2;
  int iStack_1a0;
  undefined4 uStack_19c;
  StructBuilder local_198;
  ElementCount local_16c;
  Iterator local_168;
  uint i;
  Iterator __end4;
  Iterator __begin4;
  Range<unsigned_int> *__range4;
  ListReader *list_1;
  ListReader *__end3;
  ListReader *__begin3;
  ArrayPtr<const_capnp::_::ListReader> *__range3;
  ListElementCount pos;
  ListBuilder builder;
  WordCount64 local_f8;
  Fault local_f0;
  Fault f_1;
  ElementSize *local_e0;
  DebugComparison<const_capnp::ElementSize_&,_capnp::ElementSize> local_d8;
  bool local_aa;
  anon_class_1_0_00000001 local_a9;
  bool _kjCondition_1;
  ListReader *pLStack_a8;
  ListReader *list;
  ListReader *__end2;
  ListReader *__begin2;
  ArrayPtr<const_capnp::_::ListReader> *__range2;
  ListElementCount elementCount;
  Fault local_78;
  Fault f;
  size_t local_68;
  DebugExpression<unsigned_long> local_60;
  undefined1 local_58 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  ElementSize elementSize_local;
  CapTableBuilder *capTable_local;
  BuilderArena *arena_local;
  OrphanBuilder *pOStack_10;
  StructSize structSize_local;
  OrphanBuilder *result;
  
  _kjCondition._39_1_ = elementSize;
  arena_local._4_4_ = structSize;
  pOStack_10 = __return_storage_ptr__;
  local_68 = kj::ArrayPtr<const_capnp::_::ListReader>::size(&lists);
  local_60 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_68);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<unsigned_long>::operator>
            ((DebugComparison<unsigned_long,_int> *)local_58,&local_60,
             (int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[25]>
              (&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xd8d,FAILED,"lists.size() > 0","_kjCondition,\"Can\'t concat empty list \"",
               (DebugComparison<unsigned_long,_int> *)local_58,
               (char (*) [25])"Can\'t concat empty list ");
    kj::_::Debug::Fault::fatal(&local_78);
  }
  __range2._0_4_ = 0;
  __begin2 = (ListReader *)&lists;
  __end2 = kj::ArrayPtr<const_capnp::_::ListReader>::begin(&lists);
  list = kj::ArrayPtr<const_capnp::_::ListReader>::end
                   ((ArrayPtr<const_capnp::_::ListReader> *)__begin2);
  do {
    if (__end2 == list) {
      builder._39_1_ = 0;
      OrphanBuilder(__return_storage_ptr__);
      if (_kjCondition._39_1_ == '\a') {
        pWVar5 = tagAsPtr(__return_storage_ptr__);
        WireHelpers::initStructListPointer
                  ((ListBuilder *)&pos,pWVar5,(SegmentBuilder *)0x0,capTable,(uint)__range2,
                   arena_local._4_4_,arena);
      }
      else {
        pWVar5 = tagAsPtr(__return_storage_ptr__);
        WireHelpers::initListPointer
                  ((ListBuilder *)&pos,pWVar5,(SegmentBuilder *)0x0,capTable,(uint)__range2,
                   _kjCondition._39_1_,arena);
      }
      if (_kjCondition._39_1_ == '\x01') {
        __range3_2._4_4_ = 0;
        __end3_2 = kj::ArrayPtr<const_capnp::_::ListReader>::begin(&lists);
        pLVar7 = kj::ArrayPtr<const_capnp::_::ListReader>::end(&lists);
        for (; __end3_2 != pLVar7; __end3_2 = __end3_2 + 1) {
          LVar3 = ListReader::size(__end3_2);
          ___end4_2 = kj::zeroTo<unsigned_int>(LVar3);
          i_2 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end4_2);
          local_288 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end4_2);
          while (bVar1 = kj::Range<unsigned_int>::Iterator::operator==((Iterator *)&i_2,&local_288),
                ((bVar1 ^ 0xffU) & 1) != 0) {
            puVar6 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i_2);
            bVar1 = ListReader::getDataElement<bool>(__end3_2,*puVar6);
            ListBuilder::setDataElement<bool>((ListBuilder *)&pos,__range3_2._4_4_,bVar1);
            __range3_2._4_4_ = assumeBits<29u,unsigned_int>(__range3_2._4_4_ + 1);
            kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i_2);
          }
        }
      }
      else if (_kjCondition._39_1_ == '\x06') {
        __range3_1._4_4_ = 0;
        __end3_1 = kj::ArrayPtr<const_capnp::_::ListReader>::begin(&lists);
        pLVar7 = kj::ArrayPtr<const_capnp::_::ListReader>::end(&lists);
        for (; __end3_1 != pLVar7; __end3_1 = __end3_1 + 1) {
          LVar3 = ListReader::size(__end3_1);
          ___end4_1 = kj::zeroTo<unsigned_int>(LVar3);
          i_1 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end4_1);
          local_208 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end4_1);
          while (bVar1 = kj::Range<unsigned_int>::Iterator::operator==((Iterator *)&i_1,&local_208),
                ((bVar1 ^ 0xffU) & 1) != 0) {
            puVar6 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i_1);
            local_20c = *puVar6;
            ListBuilder::getPointerElement(&local_228,(ListBuilder *)&pos,__range3_1._4_4_);
            ListReader::getPointerElement((PointerReader *)auStack_248,__end3_1,local_20c);
            other.capTable = pCStack_240;
            other.segment = _auStack_248;
            other.pointer = local_238;
            other.nestingLimit = iStack_230;
            other._28_4_ = uStack_22c;
            PointerBuilder::copyFrom(&local_228,other,false);
            __range3_1._4_4_ = assumeBits<29u,unsigned_int>(__range3_1._4_4_ + 1);
            kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i_1);
          }
        }
      }
      else if (_kjCondition._39_1_ == '\a') {
        __range3._0_4_ = 0;
        __end3 = kj::ArrayPtr<const_capnp::_::ListReader>::begin(&lists);
        pLVar7 = kj::ArrayPtr<const_capnp::_::ListReader>::end(&lists);
        for (; __end3 != pLVar7; __end3 = __end3 + 1) {
          LVar3 = ListReader::size(__end3);
          ___end4 = kj::zeroTo<unsigned_int>(LVar3);
          i = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end4);
          local_168 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end4);
          while (bVar1 = kj::Range<unsigned_int>::Iterator::operator==((Iterator *)&i,&local_168),
                ((bVar1 ^ 0xffU) & 1) != 0) {
            puVar6 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i);
            local_16c = *puVar6;
            ListBuilder::getStructElement(&local_198,(ListBuilder *)&pos,(uint)__range3);
            ListReader::getStructElement((StructReader *)auStack_1c8,__end3,local_16c);
            other_00.capTable = pCStack_1c0;
            other_00.segment = _auStack_1c8;
            other_00.data = local_1b8;
            other_00.pointers = pWStack_1b0;
            other_00.dataSize = local_1a8;
            other_00.pointerCount = SStack_1a4;
            other_00._38_2_ = uStack_1a2;
            other_00.nestingLimit = iStack_1a0;
            other_00._44_4_ = uStack_19c;
            StructBuilder::copyContentFrom(&local_198,other_00);
            __range3._0_4_ = assumeBits<29u,unsigned_int>((uint)__range3 + 1);
            kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i);
          }
        }
      }
      else {
        pCStack_298 = builder.capTable;
        __end3_3 = kj::ArrayPtr<const_capnp::_::ListReader>::begin(&lists);
        pLVar7 = kj::ArrayPtr<const_capnp::_::ListReader>::end(&lists);
        for (; __end3_3 != pLVar7; __end3_3 = __end3_3 + 1) {
          LVar3 = ListReader::size(__end3_3);
          uVar8 = upgradeBound<unsigned_long,unsigned_int>(LVar3);
          uVar8 = (builder.ptr._4_4_ >> 3) * uVar8;
          from = __end3_3->ptr;
          uVar9 = assumeBits<29u,unsigned_long>(uVar8);
          WireHelpers::copyMemory((byte *)pCStack_298,from,(ByteCount32)uVar9);
          pCStack_298 = (CapTableBuilder *)((long)&pCStack_298->super_CapTableReader + uVar8);
        }
      }
      __return_storage_ptr__->segment = _pos;
      __return_storage_ptr__->capTable = capTable;
      pwVar10 = ListBuilder::getLocation((ListBuilder *)&pos);
      __return_storage_ptr__->location = pwVar10;
      return __return_storage_ptr__;
    }
    pLStack_a8 = __end2;
    __range2._0_4_ =
         assertMaxBits<29u,unsigned_int,capnp::_::OrphanBuilder::concat(capnp::_::BuilderArena*,capnp::_::CapTableBuilder*,capnp::ElementSize,capnp::_::StructSize,kj::ArrayPtr<capnp::_::ListReader_const>)::__0>
                   ((uint)__range2 + __end2->elementCount,&local_a9);
    if (pLStack_a8->elementSize != _kjCondition._39_1_) {
      local_e0 = (ElementSize *)
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&pLStack_a8->elementSize);
      f_1.exception._7_1_ = 1;
      kj::_::DebugExpression<capnp::ElementSize_const&>::operator!=
                (&local_d8,(DebugExpression<capnp::ElementSize_const&> *)&local_e0,
                 (ElementSize *)((long)&f_1.exception + 7));
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_d8);
      local_2e1 = bVar1 && _kjCondition._39_1_ != '\x01';
      local_aa = local_2e1;
      if (!bVar1 || _kjCondition._39_1_ == '\x01') {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[40]>
                  (&local_f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0xd97,FAILED,
                   "list.elementSize != ElementSize::BIT && elementSize != ElementSize::BIT",
                   "_kjCondition,\"can\'t upgrade bit lists to struct lists\"",&local_aa,
                   (char (*) [40])"can\'t upgrade bit lists to struct lists");
        kj::_::Debug::Fault::fatal(&local_f0);
      }
      _kjCondition._39_1_ = 7;
    }
    local_f8 = WireHelpers::roundBitsUpToWords((ulong)pLStack_a8->structDataSize);
    WVar4 = kj::max<unsigned_short&,unsigned_long>
                      ((unsigned_short *)((long)&arena_local + 4),&local_f8);
    arena_local._4_4_ = (StructSize)CONCAT22(arena_local._6_2_,(short)WVar4);
    WVar2 = kj::max<unsigned_short&,unsigned_short_const&>
                      ((unsigned_short *)((long)&arena_local + 6),&pLStack_a8->structPointerCount);
    arena_local._4_4_ = (StructSize)CONCAT22(WVar2,arena_local._4_2_);
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

OrphanBuilder OrphanBuilder::concat(
    BuilderArena* arena, CapTableBuilder* capTable,
    ElementSize elementSize, StructSize structSize,
    kj::ArrayPtr<const ListReader> lists) {
  KJ_REQUIRE(lists.size() > 0, "Can't concat empty list ");

  // Find the overall element count and size.
  ListElementCount elementCount = ZERO * ELEMENTS;
  for (auto& list: lists) {
    elementCount = assertMaxBits<LIST_ELEMENT_COUNT_BITS>(elementCount + list.elementCount,
        []() { KJ_FAIL_REQUIRE("concatenated list exceeds list size limit"); });
    if (list.elementSize != elementSize) {
      // If element sizes don't all match, upgrade to struct list.
      KJ_REQUIRE(list.elementSize != ElementSize::BIT && elementSize != ElementSize::BIT,
                 "can't upgrade bit lists to struct lists");
      elementSize = ElementSize::INLINE_COMPOSITE;
    }
    structSize.data = kj::max(structSize.data,
        WireHelpers::roundBitsUpToWords(list.structDataSize));
    structSize.pointers = kj::max(structSize.pointers, list.structPointerCount);
  }

  // Allocate the list.
  OrphanBuilder result;
  ListBuilder builder = (elementSize == ElementSize::INLINE_COMPOSITE)
      ? WireHelpers::initStructListPointer(
          result.tagAsPtr(), nullptr, capTable, elementCount, structSize, arena)
      : WireHelpers::initListPointer(
          result.tagAsPtr(), nullptr, capTable, elementCount, elementSize, arena);

  // Copy elements.
  switch (elementSize) {
    case ElementSize::INLINE_COMPOSITE: {
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.getStructElement(pos).copyContentFrom(list.getStructElement(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    case ElementSize::POINTER: {
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.getPointerElement(pos).copyFrom(list.getPointerElement(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    case ElementSize::BIT: {
      // It's difficult to memcpy() bits since a list could start or end mid-byte. For now we
      // do a slow, naive loop. Probably no one will ever care.
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.setDataElement<bool>(pos, list.getDataElement<bool>(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    default: {
      // We know all the inputs are primitives with identical size because otherwise we would have
      // chosen INLINE_COMPOSITE. Therefore, we can safely use memcpy() here instead of copying
      // each element manually.
      byte* target = builder.ptr;
      auto step = builder.step / BITS_PER_BYTE;
      for (auto& list: lists) {
        auto count = step * upgradeBound<uint64_t>(list.size());
        WireHelpers::copyMemory(target, list.ptr, assumeBits<SEGMENT_WORD_COUNT_BITS>(count));
        target += count;
      }
      break;
    }
  }

  // Return orphan.
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}